

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infcover.c
# Opt level: O3

void mem_done(zng_stream *strm,char *prefix)

{
  long *__ptr;
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  undefined8 *__ptr_00;
  
  __ptr = (long *)strm->opaque;
  uVar3 = 0;
  fprintf(_stderr,"%s: %lu high water mark\n",prefix,__ptr[2]);
  __ptr_00 = (undefined8 *)*__ptr;
  if ((undefined8 *)*__ptr == (undefined8 *)0x0) {
    lVar2 = __ptr[1];
    if (lVar2 == 0) goto LAB_00102029;
    uVar3 = 0;
  }
  else {
    do {
      free((void *)*__ptr_00);
      puVar1 = (undefined8 *)__ptr_00[2];
      free(__ptr_00);
      uVar3 = uVar3 + 1;
      __ptr_00 = puVar1;
    } while (puVar1 != (undefined8 *)0x0);
    lVar2 = __ptr[1];
  }
  fprintf(_stderr,"** %s: %lu bytes in %d blocks not freed\n",prefix,lVar2,(ulong)uVar3);
LAB_00102029:
  if ((int)__ptr[4] != 0) {
    fprintf(_stderr,"** %s: %d frees not LIFO\n",prefix);
  }
  if (*(int *)((long)__ptr + 0x24) != 0) {
    fprintf(_stderr,"** %s: %d frees not recognized\n",prefix);
  }
  free(__ptr);
  strm->zalloc = (alloc_func)0x0;
  strm->zfree = (free_func)0x0;
  strm->opaque = (void *)0x0;
  return;
}

Assistant:

static void mem_done(PREFIX3(stream) *strm, char *prefix) {
    int count = 0;
    struct mem_item *item, *next;
    struct mem_zone *zone = strm->opaque;

    /* show high water mark */
    mem_high(strm, prefix);

    /* free leftover allocations and item structures, if any */
    item = zone->first;
    while (item != NULL) {
        free(item->ptr);
        next = item->next;
        free(item);
        item = next;
        count++;
    }

    /* issue alerts about anything unexpected */
    if (count || zone->total)
        fprintf(stderr, "** %s: %" PRIu64 " bytes in %d blocks not freed\n",
                prefix, (uint64_t)zone->total, count);
    if (zone->notlifo)
        fprintf(stderr, "** %s: %d frees not LIFO\n", prefix, zone->notlifo);
    if (zone->rogue)
        fprintf(stderr, "** %s: %d frees not recognized\n",
                prefix, zone->rogue);

    /* free the zone and delete from the stream */
    free(zone);
    strm->opaque = NULL;
    strm->zalloc = NULL;
    strm->zfree = NULL;
}